

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int togglereadonlyall(int f,int n)

{
  char *__s;
  size_t sVar1;
  buffer **ppbVar2;
  bool bVar3;
  
  bVar3 = allbro == 0;
  allbro = (int)bVar3;
  ppbVar2 = &bheadp;
  while (ppbVar2 = (buffer **)(((buffer *)ppbVar2)->b_list).l_p.x_bp,
        (buffer *)ppbVar2 != (buffer *)0x0) {
    __s = (((buffer *)ppbVar2)->b_list).l_name;
    if (*__s != '*') {
      sVar1 = strlen(__s);
      if (__s[(int)sVar1 + -1] != '*') {
        ((buffer *)ppbVar2)->b_flag = ((buffer *)ppbVar2)->b_flag & 0xefU | bVar3 << 4;
      }
    }
  }
  curwp->w_rflag = curwp->w_rflag | 0x10;
  return 1;
}

Assistant:

int
togglereadonlyall(int f, int n)
{
	struct buffer *bp = NULL;
	int len = 0;

	allbro = !allbro;
	for (bp = bheadp; bp != NULL; bp = bp->b_bufp) {
		len = strlen(bp->b_bname);
		if (bp->b_bname[0] != '*' && bp->b_bname[len - 1] != '*') {
			if (allbro)
				bp->b_flag |= BFREADONLY;
			else
				bp->b_flag &= ~BFREADONLY;
		}
	}
	curwp->w_rflag |= WFMODE;

	return (TRUE);
}